

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

bool __thiscall
glcts::UniformBlocksLayoutBindingCase::UniformBlocksLayoutBindingProgram::setBindingPoints
          (UniformBlocksLayoutBindingProgram *this,StringVector *list,GLint bindingPoint)

{
  GLuint GVar1;
  bool bVar2;
  pointer pbVar3;
  
  pbVar3 = (list->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar3 == (list->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = true;
  }
  else {
    do {
      GVar1 = (*((this->super_LayoutBindingProgram).m_gl)->getUniformBlockIndex)
                        ((((this->super_LayoutBindingProgram).m_program)->m_program).m_program,
                         (pbVar3->_M_dataplus)._M_p);
      bVar2 = GVar1 != 0xffffffff;
      if (GVar1 == 0xffffffff) {
        return bVar2;
      }
      (*((this->super_LayoutBindingProgram).m_gl)->uniformBlockBinding)
                ((((this->super_LayoutBindingProgram).m_program)->m_program).m_program,GVar1,
                 bindingPoint);
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (list->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return bVar2;
}

Assistant:

virtual void teardownTest()
	{
		for (Texture2DMap::iterator it = m_textures2D.begin(); it != m_textures2D.end(); it++)
		{
			delete it->second;
		}
		m_textures2D.clear();

		for (Texture2DArrayMap::iterator it = m_textures2DArray.begin(); it != m_textures2DArray.end(); it++)
		{
			delete it->second;
		}
		m_textures2DArray.clear();

		for (Texture3DMap::iterator it = m_textures3D.begin(); it != m_textures3D.end(); it++)
		{
			delete it->second;
		}
		m_textures3D.clear();
	}